

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

int cmsysProcess_SetCommand(cmsysProcess *cp,char **command)

{
  int iVar1;
  char *__ptr;
  long lVar2;
  char **__ptr_00;
  
  if (cp == (cmsysProcess *)0x0) {
    iVar1 = 0;
  }
  else {
    if (0 < cp->NumberOfCommands) {
      lVar2 = 0;
      do {
        __ptr_00 = cp->Commands[lVar2];
        __ptr = *__ptr_00;
        if (__ptr != (char *)0x0) {
          do {
            __ptr_00 = __ptr_00 + 1;
            free(__ptr);
            __ptr = *__ptr_00;
          } while (__ptr != (char *)0x0);
          __ptr_00 = cp->Commands[lVar2];
        }
        free(__ptr_00);
        lVar2 = lVar2 + 1;
      } while (lVar2 < cp->NumberOfCommands);
    }
    cp->NumberOfCommands = 0;
    if (cp->Commands != (char ***)0x0) {
      free(cp->Commands);
      cp->Commands = (char ***)0x0;
    }
    if (command != (char **)0x0) {
      iVar1 = cmsysProcess_AddCommand(cp,command);
      return iVar1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int kwsysProcess_SetCommand(kwsysProcess* cp, char const* const* command)
{
  int i;
  if(!cp)
    {
    return 0;
    }
  for(i=0; i < cp->NumberOfCommands; ++i)
    {
    char** c = cp->Commands[i];
    while(*c)
      {
      free(*c++);
      }
    free(cp->Commands[i]);
    }
  cp->NumberOfCommands = 0;
  if(cp->Commands)
    {
    free(cp->Commands);
    cp->Commands = 0;
    }
  if(command)
    {
    return kwsysProcess_AddCommand(cp, command);
    }
  return 1;
}